

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.hpp
# Opt level: O2

void __thiscall
PieceWiseCubicSpline<2>::_Spline::interp
          (_Spline *this,PieceWiseCubicSpline<2> *host,vector<double,_std::allocator<double>_> *t,
          VectorXd *y)

{
  VectorXd *this_00;
  VectorXd *this_01;
  VectorXd *this_02;
  ulong index;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer pdVar7;
  double *pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint __line;
  PieceWiseCubicSpline<2> *pPVar11;
  int iVar12;
  CoeffReturnType pdVar13;
  Scalar *pSVar14;
  long index_00;
  ulong uVar15;
  ulong index_01;
  long lVar16;
  char *__assertion;
  int iVar17;
  ulong uVar18;
  long lVar19;
  _Spline *p_Var20;
  double dVar21;
  Scalar SVar22;
  double dVar23;
  undefined1 local_340 [16];
  _Spline *local_330;
  PieceWiseCubicSpline<2> *local_328;
  ulong local_320;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triplets;
  VectorXd d;
  SparseMatrix<double,_0,_int> A;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  
  uVar18 = (long)(t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  lVar19 = (long)uVar18 >> 3;
  local_328 = host;
  if (lVar19 != (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
     ) {
    __assertion = "t.size() == y.size()";
    __line = 0x44;
LAB_00106134:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                  ,__line,
                  "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                 );
  }
  this->t_ptr = t;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&this->y,y);
  lVar16 = (long)(int)(uVar18 >> 3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&solver,lVar16);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&d,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&solver);
  triplets.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  triplets.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  triplets.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::reserve
            (&triplets,lVar19 * 0x300000000 >> 0x20);
  iVar12 = (int)lVar19;
  local_320 = (ulong)(iVar12 - 1);
  A._0_4_ = 1;
  local_330 = this;
  while( true ) {
    pPVar11 = local_328;
    p_Var20 = local_330;
    iVar17 = (int)local_320;
    if ((int)local_320 <= (int)A._0_4_) break;
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)(A._0_4_ + 1));
    dVar21 = *pdVar13;
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)(int)A._0_4_);
    dVar1 = *pdVar13;
    lVar19 = (long)(int)A._0_4_;
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = pdVar7[lVar19 + 1];
    dVar23 = pdVar7[lVar19];
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,lVar19);
    dVar3 = *pdVar13;
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)(int)A._0_4_ + -1);
    dVar4 = *pdVar13;
    lVar19 = (long)(int)A._0_4_;
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar5 = pdVar7[lVar19 + -1];
    dVar6 = pdVar7[lVar19];
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&d,lVar19);
    *pSVar14 = (dVar21 - dVar1) / (dVar2 - dVar23) - (dVar3 - dVar4) / (dVar6 - dVar5);
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    solver._0_8_ = (pdVar7[(int)A._0_4_] - pdVar7[(long)(int)A._0_4_ + -1]) / 3.0;
    local_340._0_4_ = A._0_4_ + -1;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int&,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar21 = pdVar7[(long)(int)A._0_4_ + 1] - pdVar7[(long)(int)A._0_4_ + -1];
    solver._0_8_ = (dVar21 + dVar21) / 3.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int&,int&,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)&A,(double *)&solver);
    local_340._0_4_ = A._0_4_ + 1;
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    solver._0_8_ = (pdVar7[(long)(int)A._0_4_ + 1] - pdVar7[(int)A._0_4_]) / 3.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int&,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    A._0_4_ = A._0_4_ + 1;
  }
  if (local_328->left_condition_ == FirstDeriv) {
    A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
    A._1_3_ = 0;
    auVar10._12_4_ = 0;
    auVar10._0_12_ = local_340._4_12_;
    local_340 = auVar10 << 0x20;
    pdVar8 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar21 = pdVar8[1] - *pdVar8;
    solver._0_8_ = dVar21 + dVar21;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    p_Var20 = local_330;
    iVar17 = (int)local_320;
    A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
    A._1_3_ = 0;
    local_340._0_4_ = 1;
    pdVar8 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    solver._0_8_ = pdVar8[1] - *pdVar8;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,1);
    dVar21 = *pdVar13;
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,0);
    dVar1 = *pdVar13;
    pdVar8 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = *pdVar8;
    dVar23 = pdVar8[1];
    dVar3 = pPVar11->left_cond_value_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&d,0);
    SVar22 = ((dVar21 - dVar1) / (dVar23 - dVar2) - dVar3) * 3.0;
  }
  else {
    if (local_328->left_condition_ != SecondDeriv) {
      __assertion = "false";
      __line = 0x65;
      goto LAB_00106134;
    }
    A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
    A._1_3_ = 0;
    auVar9._12_4_ = 0;
    auVar9._0_12_ = local_340._4_12_;
    local_340 = auVar9 << 0x20;
    solver.
    super_SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>_>
    .m_isInitialized = false;
    solver._1_3_ = 0;
    solver.m_info = 0x40000000;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
    A._1_3_ = 0;
    local_340._0_4_ = 1;
    solver.
    super_SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>_>
    .m_isInitialized = false;
    solver._1_3_ = 0;
    solver.m_info = Success;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    SVar22 = pPVar11->left_cond_value_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&d,0);
  }
  *pSVar14 = SVar22;
  lVar19 = (long)iVar17;
  local_340._0_4_ = iVar17;
  if (pPVar11->right_condition_ == FirstDeriv) {
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar21 = pdVar7[lVar19] - pdVar7[(long)iVar12 + -2];
    solver._0_8_ = dVar21 + dVar21;
    A._0_4_ = iVar17;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    index_00 = (long)iVar12 + -2;
    local_340._0_4_ = iVar12 + -2;
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    solver._0_8_ = pdVar7[lVar19] - pdVar7[index_00];
    A._0_4_ = iVar17;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    dVar21 = local_328->right_cond_value_;
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,lVar19);
    p_Var20 = local_330;
    dVar1 = *pdVar13;
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,index_00);
    dVar2 = *pdVar13;
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar23 = pdVar7[lVar19];
    dVar3 = pdVar7[index_00];
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&d,lVar19);
    SVar22 = (dVar21 - (dVar1 - dVar2) / (dVar23 - dVar3)) * 3.0;
  }
  else {
    if (pPVar11->right_condition_ != SecondDeriv) {
      __assertion = "false";
      __line = 0x77;
      goto LAB_00106134;
    }
    solver.
    super_SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>_>
    .m_isInitialized = false;
    solver._1_3_ = 0;
    solver.m_info = 0x40000000;
    A._0_4_ = iVar17;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    pPVar11 = local_328;
    local_340._0_4_ = iVar12 + -2;
    solver.
    super_SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>_>
    .m_isInitialized = false;
    solver._1_3_ = 0;
    solver.m_info = Success;
    A._0_4_ = iVar17;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &triplets,(int *)&A,(int *)local_340,(double *)&solver);
    SVar22 = pPVar11->right_cond_value_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&d,lVar19);
  }
  *pSVar14 = SVar22;
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&A,lVar16,lVar16);
  solver._0_8_ = triplets.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_340._0_8_ =
       triplets.
       super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Eigen::SparseMatrix<double,0,int>::
  setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
            ((SparseMatrix<double,0,int> *)&A,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)&solver,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)local_340);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            (&solver);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
            (&solver,&A);
  local_340 = (undefined1  [16])
              Eigen::
              SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
              ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                          *)&solver,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&d);
  this_00 = &p_Var20->b;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (this_00,(Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_340);
  this_01 = &p_Var20->a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar16);
  this_02 = &p_Var20->c;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_02->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar16);
  index_01 = 0;
  uVar15 = local_320 & 0xffffffff;
  if ((int)local_320 < 1) {
    uVar15 = index_01;
  }
  while (pPVar11 = local_328, p_Var20 = local_330, uVar15 != index_01) {
    index = index_01 + 1;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index
                        );
    dVar21 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                         index_01);
    dVar1 = *pSVar14;
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = pdVar7[index_01];
    dVar23 = pdVar7[index_01 + 1];
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,
                         index_01);
    *pSVar14 = ((dVar21 - dVar1) / (dVar23 - dVar2)) / 3.0;
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,index);
    dVar21 = *pdVar13;
    pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,index_01);
    dVar1 = *pdVar13;
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = pdVar7[index_01 + 1];
    dVar23 = pdVar7[index_01];
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                         index_01);
    dVar3 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index
                        );
    dVar4 = *pSVar14;
    pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar5 = pdVar7[index_01];
    dVar6 = pdVar7[index_01 + 1];
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_02,
                         index_01);
    *pSVar14 = ((dVar6 - dVar5) * (dVar3 + dVar3 + dVar4)) / -3.0 +
               (dVar21 - dVar1) / (dVar2 - dVar23);
    index_01 = index;
  }
  SVar22 = 0.0;
  if (local_328->force_linear_extrapolation_ == false) {
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    SVar22 = *pSVar14;
  }
  p_Var20->b0 = SVar22;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_02,0);
  p_Var20->c0 = *pSVar14;
  pdVar7 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar16 = uVar18 * 0x20000000 + -0x200000000;
  dVar23 = pdVar7[lVar19] - *(double *)((long)pdVar7 + (lVar16 >> 0x1d));
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,lVar19)
  ;
  lVar16 = lVar16 >> 0x20;
  *pSVar14 = 0.0;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,lVar16)
  ;
  dVar21 = *pSVar14;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,lVar16)
  ;
  dVar1 = *pSVar14;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_02,lVar16)
  ;
  dVar2 = *pSVar14;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_02,lVar19)
  ;
  *pSVar14 = dVar21 * 3.0 * dVar23 * dVar23 + (dVar1 + dVar1) * dVar23 + dVar2;
  if (pPVar11->force_linear_extrapolation_ == true) {
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                         lVar19);
    *pSVar14 = 0.0;
  }
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
            (&solver);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&A);
  std::_Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
  ~_Vector_base(&triplets.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
               );
  free(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void interp(PieceWiseCubicSpline<>& host, const vector<double>& t, const Eigen::VectorXd& y) {
      assert(t.size() == y.size());
      const int N = y.size();
      this->t_ptr = &t;
      this->y = y;

      // build Am=d
      Eigen::VectorXd d = Eigen::VectorXd::Zero(N);
      vector<Eigen::Triplet<double>> triplets;
      triplets.reserve(3 * N);

      // build h
      for (int i = 1; i < N - 1; ++i) {
        d[i] = (y[i + 1] - y[i]) / (t[i + 1] - t[i]) - (y[i] - y[i - 1]) / (t[i] - t[i - 1]);
        triplets.emplace_back(i, i - 1, (t[i] - t[i - 1]) / 3.0);
        triplets.emplace_back(i, i, 2 * (t[i + 1] - t[i - 1]) / 3.0);
        triplets.emplace_back(i, i + 1, (t[i + 1] - t[i]) / 3.0);
      }

      // boundary conditions
      if (host.left_condition_ == SecondDeriv) {
        // 2*b[0] = f''
        triplets.emplace_back(0, 0, 2.0);
        triplets.emplace_back(0, 1, 0.0);

        d[0] = host.left_cond_value_;
      } else if (host.left_condition_ == FirstDeriv) {
        // c[0] = f', needs to be re-expressed in terms of b:
        // (2b[0]+b[1])(x[1]-x[0]) = 3 ((y[1]-y[0])/(x[1]-x[0]) - f')
        triplets.emplace_back(0, 0, 2.0 * (t[1] - t[0]));
        triplets.emplace_back(0, 1, 1.0 * (t[1] - t[0]));

        d[0] = 3.0 * ((y[1] - y[0]) / (t[1] - t[0]) - host.left_cond_value_);
      } else {
        assert(false);
      }
      if (host.right_condition_ == SecondDeriv) {
        // 2*b[n-1] = f''
        triplets.emplace_back(N - 1, N - 1, 2.0);
        triplets.emplace_back(N - 1, N - 2, 0.0);

        d[N - 1] = host.right_cond_value_;

      } else if (host.right_condition_ == FirstDeriv) {
        // c[n-1] = f', needs to be re-expressed in terms of b:
        // (b[n-2]+2b[n-1])(x[n-1]-x[n-2])
        // = 3 (f' - (y[n-1]-y[n-2])/(x[n-1]-x[n-2]))
        triplets.emplace_back(N - 1, N - 1, 2.0 * (t[N - 1] - t[N - 2]));
        triplets.emplace_back(N - 1, N - 2, 1.0 * (t[N - 1] - t[N - 2]));

        d[N - 1] = 3.0 * (host.right_cond_value_ - (y[N - 1] - y[N - 2]) / (t[N - 1] - t[N - 2]));
      } else {
        assert(false);
      }

      // solve the equation system to obtain the parameters b[]
      Eigen::SparseMatrix<double> A(N, N);
      A.setFromTriplets(triplets.begin(), triplets.end());

      Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
      solver.compute(A);
      b = solver.solve(d);

      a.resize(N);
      c.resize(N);
      for (int i = 0; i < N - 1; i++) {
        a[i] = (b[i + 1] - b[i]) / (t[i + 1] - t[i]) / 3.0;
        c[i] = (y[i + 1] - y[i]) / (t[i + 1] - t[i]) -
               (2.0 * b[i] + b[i + 1]) * (t[i + 1] - t[i]) / 3.0;
      }

      // for left extrapolation coefficients
      b0 = (!host.force_linear_extrapolation_) ? b[0] : 0.0;
      c0 = c[0];

      // for the right extrapolation coefficients
      // f_{n-1}(x) = b*(x-x_{n-1})^2 + c*(x-x_{n-1}) + y{n-1}
      double h = t[N - 1] - t[N - 2];
      // b[N-1] is determined by the boundary condition
      a[N - 1] = 0.0;
      c[N - 1] = 3.0 * a[N - 2] * h * h + 2.0 * b[N - 2] * h + c[N - 2];  // = f'_{n-2}(x_{n-1})
      if (host.force_linear_extrapolation_) {
        {
          b[N - 1] = 0.0;
        }
      }
    }